

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O2

void VisitParseTreeNodes(SynBase *syntax,void *context,_func_void_void_ptr_SynBase_ptr *accept)

{
  long lVar1;
  long lVar2;
  SynBase *pSVar3;
  InplaceStr *pIVar4;
  SynBase **ppSVar5;
  
  lVar1 = 0x50;
LAB_00117069:
  if (syntax == (SynBase *)0x0) {
    return;
  }
  (*accept)(context,syntax);
  lVar2 = 0x40;
  switch(syntax->typeID) {
  case 7:
    pSVar3 = (SynBase *)syntax[1]._vptr_SynBase;
    while (pSVar3 != (SynBase *)0x0) {
      VisitParseTreeNodes(pSVar3,context,accept);
      pSVar3 = pSVar3->next;
      if ((pSVar3 == (SynBase *)0x0) || (pSVar3->typeID != 4)) {
        pSVar3 = (SynBase *)0x0;
      }
    }
    break;
  default:
    break;
  case 9:
    VisitParseTreeNodes((SynBase *)syntax[1]._vptr_SynBase,context,accept);
    ppSVar5 = (SynBase **)&syntax[1].typeID;
    while (pSVar3 = *ppSVar5, pSVar3 != (SynBase *)0x0) {
      VisitParseTreeNodes(pSVar3,context,accept);
      ppSVar5 = &pSVar3->next;
    }
    break;
  case 10:
  case 0xd:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x2f:
  case 0x38:
    goto switchD_0011709f_caseD_a;
  case 0xb:
    VisitParseTreeNodes((SynBase *)syntax[1]._vptr_SynBase,context,accept);
    ppSVar5 = (SynBase **)&syntax[1].typeID;
    while (pSVar3 = *ppSVar5, pSVar3 != (SynBase *)0x0) {
      VisitParseTreeNodes(pSVar3,context,accept);
      ppSVar5 = &pSVar3->next;
    }
    break;
  case 0xc:
    VisitParseTreeNodes((SynBase *)syntax[1]._vptr_SynBase,context,accept);
    ppSVar5 = (SynBase **)&syntax[1].typeID;
    while (pSVar3 = *ppSVar5, pSVar3 != (SynBase *)0x0) {
      VisitParseTreeNodes(pSVar3,context,accept);
      ppSVar5 = &pSVar3->next;
    }
    break;
  case 0x13:
    for (pSVar3 = syntax + 1; pSVar3 = (SynBase *)pSVar3->_vptr_SynBase, pSVar3 != (SynBase *)0x0;
        pSVar3 = (SynBase *)&pSVar3->next) {
      VisitParseTreeNodes(pSVar3,context,accept);
    }
    break;
  case 0x14:
    for (pSVar3 = syntax + 1; pSVar3 = (SynBase *)pSVar3->_vptr_SynBase, pSVar3 != (SynBase *)0x0;
        pSVar3 = (SynBase *)&pSVar3->next) {
      VisitParseTreeNodes(pSVar3,context,accept);
    }
    break;
  case 0x18:
  case 0x33:
  case 0x3a:
    goto switchD_0011709f_caseD_18;
  case 0x19:
    VisitParseTreeNodes((SynBase *)syntax[1]._vptr_SynBase,context,accept);
    ppSVar5 = (SynBase **)&syntax[1].typeID;
    while (pSVar3 = *ppSVar5, pSVar3 != (SynBase *)0x0) {
      VisitParseTreeNodes(pSVar3,context,accept);
      ppSVar5 = &pSVar3->next;
    }
    break;
  case 0x1a:
    VisitParseTreeNodes((SynBase *)syntax[1]._vptr_SynBase,context,accept);
    ppSVar5 = (SynBase **)&syntax[1].typeID;
    while (pSVar3 = *ppSVar5, pSVar3 != (SynBase *)0x0) {
      VisitParseTreeNodes(pSVar3,context,accept);
      ppSVar5 = &pSVar3->next;
    }
    ppSVar5 = (SynBase **)&syntax[1].end;
    while (pSVar3 = *ppSVar5, pSVar3 != (SynBase *)0x0) {
      VisitParseTreeNodes(pSVar3,context,accept);
      ppSVar5 = &pSVar3->next;
    }
    break;
  case 0x20:
    VisitParseTreeNodes((SynBase *)syntax[1]._vptr_SynBase,context,accept);
    ppSVar5 = (SynBase **)&syntax[1].typeID;
    while (pSVar3 = *ppSVar5, pSVar3 != (SynBase *)0x0) {
      VisitParseTreeNodes(pSVar3,context,accept);
      ppSVar5 = &pSVar3->next;
    }
    VisitParseTreeNodes((SynBase *)syntax[1].end,context,accept);
    pIVar4 = &syntax[1].pos;
    while (pSVar3 = (SynBase *)pIVar4->begin, pSVar3 != (SynBase *)0x0) {
      VisitParseTreeNodes(pSVar3,context,accept);
      pIVar4 = (InplaceStr *)&pSVar3->next;
    }
    break;
  case 0x21:
  case 0x27:
  case 0x3d:
    VisitParseTreeNodes((SynBase *)syntax[1]._vptr_SynBase,context,accept);
    pSVar3 = *(SynBase **)&syntax[1].typeID;
    goto LAB_001170d1;
  case 0x26:
    for (pSVar3 = syntax + 1; pSVar3 = (SynBase *)pSVar3->_vptr_SynBase, pSVar3 != (SynBase *)0x0;
        pSVar3 = (SynBase *)&pSVar3->next) {
      VisitParseTreeNodes(pSVar3,context,accept);
    }
    break;
  case 0x28:
    VisitParseTreeNodes((SynBase *)syntax[1]._vptr_SynBase,context,accept);
    VisitParseTreeNodes(*(SynBase **)&syntax[1].typeID,context,accept);
  case 0x35:
    VisitParseTreeNodes((SynBase *)syntax[1].begin,context,accept);
    lVar2 = 0x58;
    goto switchD_0011709f_caseD_a;
  case 0x29:
  case 0x36:
    pSVar3 = (SynBase *)syntax[1]._vptr_SynBase;
LAB_001170d1:
    VisitParseTreeNodes(pSVar3,context,accept);
    lVar2 = lVar1;
    goto switchD_0011709f_caseD_a;
  case 0x2a:
    for (pSVar3 = syntax + 1; pSVar3 = (SynBase *)pSVar3->_vptr_SynBase, lVar2 = lVar1,
        pSVar3 != (SynBase *)0x0; pSVar3 = (SynBase *)&pSVar3->next) {
      VisitParseTreeNodes(pSVar3,context,accept);
    }
    goto switchD_0011709f_caseD_a;
  case 0x2b:
  case 0x30:
  case 0x31:
  case 0x32:
    VisitParseTreeNodes((SynBase *)syntax[1]._vptr_SynBase,context,accept);
switchD_0011709f_caseD_18:
    lVar2 = 0x48;
    goto switchD_0011709f_caseD_a;
  case 0x2c:
    for (pSVar3 = syntax + 1; pSVar3 = (SynBase *)pSVar3->_vptr_SynBase, lVar2 = lVar1,
        pSVar3 != (SynBase *)0x0; pSVar3 = (SynBase *)&pSVar3->next) {
      VisitParseTreeNodes(pSVar3,context,accept);
    }
    goto switchD_0011709f_caseD_a;
  case 0x2d:
    VisitParseTreeNodes((SynBase *)syntax[1]._vptr_SynBase,context,accept);
    ppSVar5 = (SynBase **)&syntax[1].typeID;
    while (pSVar3 = *ppSVar5, pSVar3 != (SynBase *)0x0) {
      VisitParseTreeNodes(pSVar3,context,accept);
      ppSVar5 = &pSVar3->next;
    }
    break;
  case 0x2e:
    VisitParseTreeNodes((SynBase *)syntax[1]._vptr_SynBase,context,accept);
    ppSVar5 = (SynBase **)&syntax[1].typeID;
    while (pSVar3 = *ppSVar5, pSVar3 != (SynBase *)0x0) {
      VisitParseTreeNodes(pSVar3,context,accept);
      ppSVar5 = &pSVar3->next;
    }
    break;
  case 0x34:
    VisitParseTreeNodes((SynBase *)syntax[1]._vptr_SynBase,context,accept);
    VisitParseTreeNodes(*(SynBase **)&syntax[1].typeID,context,accept);
    ppSVar5 = (SynBase **)&syntax[1].begin;
    while (pSVar3 = *ppSVar5, pSVar3 != (SynBase *)0x0) {
      VisitParseTreeNodes(pSVar3,context,accept);
      ppSVar5 = &pSVar3->next;
    }
    break;
  case 0x37:
    VisitParseTreeNodes((SynBase *)syntax[1]._vptr_SynBase,context,accept);
    VisitParseTreeNodes((SynBase *)syntax[1].begin,context,accept);
    ppSVar5 = (SynBase **)&syntax[1].pos.end;
    while (pSVar3 = *ppSVar5, pSVar3 != (SynBase *)0x0) {
      VisitParseTreeNodes(pSVar3,context,accept);
      ppSVar5 = &pSVar3->next;
    }
    ppSVar5 = (SynBase **)&syntax[1].listed;
    while (pSVar3 = *ppSVar5, pSVar3 != (SynBase *)0x0) {
      VisitParseTreeNodes(pSVar3,context,accept);
      ppSVar5 = &pSVar3->next;
    }
    ppSVar5 = (SynBase **)&syntax[2].typeID;
    while (pSVar3 = *ppSVar5, pSVar3 != (SynBase *)0x0) {
      VisitParseTreeNodes(pSVar3,context,accept);
      ppSVar5 = &pSVar3->next;
    }
    break;
  case 0x39:
    for (pSVar3 = syntax + 1; pSVar3 = (SynBase *)pSVar3->_vptr_SynBase, pSVar3 != (SynBase *)0x0;
        pSVar3 = (SynBase *)&pSVar3->next) {
      VisitParseTreeNodes(pSVar3,context,accept);
    }
    ppSVar5 = (SynBase **)&syntax[1].begin;
    while (pSVar3 = *ppSVar5, pSVar3 != (SynBase *)0x0) {
      VisitParseTreeNodes(pSVar3,context,accept);
      ppSVar5 = &pSVar3->next;
    }
    break;
  case 0x3b:
    VisitParseTreeNodes((SynBase *)syntax[1]._vptr_SynBase,context,accept);
    ppSVar5 = (SynBase **)&syntax[1].typeID;
    while (pSVar3 = *ppSVar5, pSVar3 != (SynBase *)0x0) {
      VisitParseTreeNodes(pSVar3,context,accept);
      ppSVar5 = &pSVar3->next;
    }
    break;
  case 0x3e:
    for (pSVar3 = syntax + 1; pSVar3 = (SynBase *)pSVar3->_vptr_SynBase, pSVar3 != (SynBase *)0x0;
        pSVar3 = (SynBase *)&pSVar3->next) {
      VisitParseTreeNodes(pSVar3,context,accept);
    }
    ppSVar5 = (SynBase **)&syntax[1].begin;
    while (pSVar3 = *ppSVar5, pSVar3 != (SynBase *)0x0) {
      VisitParseTreeNodes(pSVar3,context,accept);
      ppSVar5 = &pSVar3->next;
    }
    pIVar4 = &syntax[1].pos;
    while (pSVar3 = (SynBase *)pIVar4->begin, pSVar3 != (SynBase *)0x0) {
      VisitParseTreeNodes(pSVar3,context,accept);
      pIVar4 = (InplaceStr *)&pSVar3->next;
    }
    pSVar3 = syntax + 1;
    while (pSVar3 = pSVar3->next, pSVar3 != (SynBase *)0x0) {
      VisitParseTreeNodes(pSVar3,context,accept);
    }
    for (pSVar3 = syntax + 2; pSVar3 = (SynBase *)pSVar3->_vptr_SynBase, pSVar3 != (SynBase *)0x0;
        pSVar3 = (SynBase *)&pSVar3->next) {
      VisitParseTreeNodes(pSVar3,context,accept);
    }
    ppSVar5 = (SynBase **)&syntax[2].begin;
    while (pSVar3 = *ppSVar5, pSVar3 != (SynBase *)0x0) {
      VisitParseTreeNodes(pSVar3,context,accept);
      ppSVar5 = &pSVar3->next;
    }
    break;
  case 0x3f:
    VisitParseTreeNodes((SynBase *)syntax[1]._vptr_SynBase,context,accept);
    ppSVar5 = (SynBase **)&syntax[1].begin;
    while (pSVar3 = *ppSVar5, pSVar3 != (SynBase *)0x0) {
      VisitParseTreeNodes(pSVar3,context,accept);
      ppSVar5 = &pSVar3->next;
    }
    VisitParseTreeNodes((SynBase *)syntax[1].pos.end,context,accept);
    lVar2 = 0x70;
switchD_0011709f_caseD_a:
    syntax = *(SynBase **)((long)&syntax->_vptr_SynBase + lVar2);
    goto LAB_00117069;
  case 0x40:
    ppSVar5 = (SynBase **)&syntax[1].typeID;
    while (pSVar3 = *ppSVar5, pSVar3 != (SynBase *)0x0) {
      VisitParseTreeNodes(pSVar3,context,accept);
      ppSVar5 = &pSVar3->next;
    }
    break;
  case 0x41:
    pSVar3 = (SynBase *)syntax[1]._vptr_SynBase;
    while (pSVar3 != (SynBase *)0x0) {
      VisitParseTreeNodes(pSVar3,context,accept);
      pSVar3 = pSVar3->next;
      if ((pSVar3 == (SynBase *)0x0) || (pSVar3->typeID != 4)) {
        pSVar3 = (SynBase *)0x0;
      }
    }
    ppSVar5 = (SynBase **)&syntax[1].begin;
    while (pSVar3 = *ppSVar5, pSVar3 != (SynBase *)0x0) {
      VisitParseTreeNodes(pSVar3,context,accept);
      ppSVar5 = &pSVar3->next;
    }
    break;
  case 0x42:
    pSVar3 = (SynBase *)syntax[1]._vptr_SynBase;
    while (pSVar3 != (SynBase *)0x0) {
      VisitParseTreeNodes(pSVar3,context,accept);
      pSVar3 = pSVar3->next;
      if ((pSVar3 == (SynBase *)0x0) || (pSVar3->typeID != 4)) {
        pSVar3 = (SynBase *)0x0;
      }
    }
    break;
  case 0x43:
    pSVar3 = (SynBase *)syntax[1]._vptr_SynBase;
    while (pSVar3 != (SynBase *)0x0) {
      VisitParseTreeNodes(pSVar3,context,accept);
      pSVar3 = pSVar3->next;
      if ((pSVar3 == (SynBase *)0x0) || (pSVar3->typeID != 0x42)) {
        pSVar3 = (SynBase *)0x0;
      }
    }
    ppSVar5 = (SynBase **)&syntax[1].begin;
    while (pSVar3 = *ppSVar5, pSVar3 != (SynBase *)0x0) {
      VisitParseTreeNodes(pSVar3,context,accept);
      ppSVar5 = &pSVar3->next;
    }
  }
  return;
}

Assistant:

void VisitParseTreeNodes(SynBase *syntax, void *context, void(*accept)(void *context, SynBase *child))
{
	if(!syntax)
		return;

	accept(context, syntax);

	if(SynTypeSimple *node = getType<SynTypeSimple>(syntax))
	{
		for(SynIdentifier *part = node->path.head; part; part = getType<SynIdentifier>(part->next))
			VisitParseTreeNodes(part, context, accept);
	}
	else if(SynTypeArray *node = getType<SynTypeArray>(syntax))
	{
		VisitParseTreeNodes(node->type, context, accept);

		for(SynBase *size = node->sizes.head; size; size = size->next)
			VisitParseTreeNodes(size, context, accept);
	}
	else if(SynTypeReference *node = getType<SynTypeReference>(syntax))
	{
		VisitParseTreeNodes(node->type, context, accept);
	}
	else if(SynTypeFunction *node = getType<SynTypeFunction>(syntax))
	{
		VisitParseTreeNodes(node->returnType, context, accept);

		for(SynBase *arg = node->arguments.head; arg; arg = arg->next)
			VisitParseTreeNodes(arg, context, accept);
	}
	else if(SynTypeGenericInstance *node = getType<SynTypeGenericInstance>(syntax))
	{
		VisitParseTreeNodes(node->baseType, context, accept);

		for(SynBase *type = node->types.head; type; type = type->next)
			VisitParseTreeNodes(type, context, accept);
	}
	else if(SynTypeof *node = getType<SynTypeof>(syntax))
	{
		VisitParseTreeNodes(node->value, context, accept);
	}
	else if(SynArray *node = getType<SynArray>(syntax))
	{
		for(SynBase *value = node->values.head; value; value = value->next)
			VisitParseTreeNodes(value, context, accept);
	}
	else if(SynGenerator *node = getType<SynGenerator>(syntax))
	{
		for(SynBase *value = node->expressions.head; value; value = value->next)
			VisitParseTreeNodes(value, context, accept);
	}
	else if(SynAlign *node = getType<SynAlign>(syntax))
	{
		VisitParseTreeNodes(node->value, context, accept);
	}
	else if(SynTypedef *node = getType<SynTypedef>(syntax))
	{
		VisitParseTreeNodes(node->type, context, accept);
	}
	else if(SynMemberAccess *node = getType<SynMemberAccess>(syntax))
	{
		VisitParseTreeNodes(node->value, context, accept);
	}
	else if(SynCallArgument *node = getType<SynCallArgument>(syntax))
	{
		VisitParseTreeNodes(node->value, context, accept);
	}
	else if(SynArrayIndex *node = getType<SynArrayIndex>(syntax))
	{
		VisitParseTreeNodes(node->value, context, accept);

		for(SynBase *arg = node->arguments.head; arg; arg = arg->next)
			VisitParseTreeNodes(arg, context, accept);
	}
	else if(SynFunctionCall *node = getType<SynFunctionCall>(syntax))
	{
		VisitParseTreeNodes(node->value, context, accept);

		for(SynBase *arg = node->aliases.head; arg; arg = arg->next)
			VisitParseTreeNodes(arg, context, accept);

		for(SynBase *arg = node->arguments.head; arg; arg = arg->next)
			VisitParseTreeNodes(arg, context, accept);
	}
	else if(SynPreModify *node = getType<SynPreModify>(syntax))
	{
		VisitParseTreeNodes(node->value, context, accept);
	}
	else if(SynPostModify *node = getType<SynPostModify>(syntax))
	{
		VisitParseTreeNodes(node->value, context, accept);
	}
	else if(SynGetAddress *node = getType<SynGetAddress>(syntax))
	{
		VisitParseTreeNodes(node->value, context, accept);
	}
	else if(SynDereference *node = getType<SynDereference>(syntax))
	{
		VisitParseTreeNodes(node->value, context, accept);
	}
	else if(SynSizeof *node = getType<SynSizeof>(syntax))
	{
		VisitParseTreeNodes(node->value, context, accept);
	}
	else if(SynNew *node = getType<SynNew>(syntax))
	{
		VisitParseTreeNodes(node->type, context, accept);

		for(SynBase *arg = node->arguments.head; arg; arg = arg->next)
			VisitParseTreeNodes(arg, context, accept);

		VisitParseTreeNodes(node->count, context, accept);

		for(SynBase *arg = node->constructor.head; arg; arg = arg->next)
			VisitParseTreeNodes(arg, context, accept);
	}
	else if(SynConditional *node = getType<SynConditional>(syntax))
	{
		VisitParseTreeNodes(node->condition, context, accept);
		VisitParseTreeNodes(node->trueBlock, context, accept);
		VisitParseTreeNodes(node->falseBlock, context, accept);
	}
	else if(SynReturn *node = getType<SynReturn>(syntax))
	{
		VisitParseTreeNodes(node->value, context, accept);
	}
	else if(SynYield *node = getType<SynYield>(syntax))
	{
		VisitParseTreeNodes(node->value, context, accept);
	}
	else if(SynBreak *node = getType<SynBreak>(syntax))
	{
		VisitParseTreeNodes(node->number, context, accept);
	}
	else if(SynContinue *node = getType<SynContinue>(syntax))
	{
		VisitParseTreeNodes(node->number, context, accept);
	}
	else if(SynBlock *node = getType<SynBlock>(syntax))
	{
		for(SynBase *expr = node->expressions.head; expr; expr = expr->next)
			VisitParseTreeNodes(expr, context, accept);
	}
	else if(SynIfElse *node = getType<SynIfElse>(syntax))
	{
		VisitParseTreeNodes(node->condition, context, accept);
		VisitParseTreeNodes(node->trueBlock, context, accept);
		VisitParseTreeNodes(node->falseBlock, context, accept);
	}
	else if(SynFor *node = getType<SynFor>(syntax))
	{
		VisitParseTreeNodes(node->initializer, context, accept);
		VisitParseTreeNodes(node->condition, context, accept);
		VisitParseTreeNodes(node->increment, context, accept);
		VisitParseTreeNodes(node->body, context, accept);
	}
	else if(SynForEachIterator *node = getType<SynForEachIterator>(syntax))
	{
		VisitParseTreeNodes(node->type, context, accept);
		VisitParseTreeNodes(node->value, context, accept);
	}
	else if(SynForEach *node = getType<SynForEach>(syntax))
	{
		for(SynBase *arg = node->iterators.head; arg; arg = arg->next)
			VisitParseTreeNodes(arg, context, accept);

		VisitParseTreeNodes(node->body, context, accept);
	}
	else if(SynWhile *node = getType<SynWhile>(syntax))
	{
		VisitParseTreeNodes(node->condition, context, accept);
		VisitParseTreeNodes(node->body, context, accept);
	}
	else if(SynDoWhile *node = getType<SynDoWhile>(syntax))
	{
		for(SynBase *arg = node->expressions.head; arg; arg = arg->next)
			VisitParseTreeNodes(arg, context, accept);

		VisitParseTreeNodes(node->condition, context, accept);
	}
	else if(SynSwitchCase *node = getType<SynSwitchCase>(syntax))
	{
		VisitParseTreeNodes(node->value, context, accept);

		for(SynBase *arg = node->expressions.head; arg; arg = arg->next)
			VisitParseTreeNodes(arg, context, accept);
	}
	else if(SynSwitch *node = getType<SynSwitch>(syntax))
	{
		VisitParseTreeNodes(node->condition, context, accept);

		for(SynBase *arg = node->cases.head; arg; arg = arg->next)
			VisitParseTreeNodes(arg, context, accept);
	}
	else if(SynUnaryOp *node = getType<SynUnaryOp>(syntax))
	{
		VisitParseTreeNodes(node->value, context, accept);
	}
	else if(SynBinaryOp *node = getType<SynBinaryOp>(syntax))
	{
		VisitParseTreeNodes(node->lhs, context, accept);
		VisitParseTreeNodes(node->rhs, context, accept);
	}
	else if(SynAssignment *node = getType<SynAssignment>(syntax))
	{
		VisitParseTreeNodes(node->lhs, context, accept);
		VisitParseTreeNodes(node->rhs, context, accept);
	}
	else if(SynModifyAssignment *node = getType<SynModifyAssignment>(syntax))
	{
		VisitParseTreeNodes(node->lhs, context, accept);
		VisitParseTreeNodes(node->rhs, context, accept);
	}
	else if(SynVariableDefinition *node = getType<SynVariableDefinition>(syntax))
	{
		VisitParseTreeNodes(node->initializer, context, accept);
	}
	else if(SynVariableDefinitions *node = getType<SynVariableDefinitions>(syntax))
	{
		VisitParseTreeNodes(node->align, context, accept);
		VisitParseTreeNodes(node->type, context, accept);

		for(SynBase *arg = node->definitions.head; arg; arg = arg->next)
			VisitParseTreeNodes(arg, context, accept);
	}
	else if(SynAccessor *node = getType<SynAccessor>(syntax))
	{
		VisitParseTreeNodes(node->getBlock, context, accept);
		VisitParseTreeNodes(node->setBlock, context, accept);
	}
	else if(SynFunctionArgument *node = getType<SynFunctionArgument>(syntax))
	{
		VisitParseTreeNodes(node->type, context, accept);
		VisitParseTreeNodes(node->initializer, context, accept);
	}
	else if(SynFunctionDefinition *node = getType<SynFunctionDefinition>(syntax))
	{
		VisitParseTreeNodes(node->parentType, context, accept);
		VisitParseTreeNodes(node->returnType, context, accept);

		for(SynBase *arg = node->aliases.head; arg; arg = arg->next)
			VisitParseTreeNodes(arg, context, accept);

		for(SynBase *arg = node->arguments.head; arg; arg = arg->next)
			VisitParseTreeNodes(arg, context, accept);

		for(SynBase *arg = node->expressions.head; arg; arg = arg->next)
			VisitParseTreeNodes(arg, context, accept);
	}
	else if(SynShortFunctionArgument *node = getType<SynShortFunctionArgument>(syntax))
	{
		VisitParseTreeNodes(node->type, context, accept);
	}
	else if(SynShortFunctionDefinition *node = getType<SynShortFunctionDefinition>(syntax))
	{
		for(SynBase *arg = node->arguments.head; arg; arg = arg->next)
			VisitParseTreeNodes(arg, context, accept);

		for(SynBase *arg = node->expressions.head; arg; arg = arg->next)
			VisitParseTreeNodes(arg, context, accept);
	}
	else if(SynConstant *node = getType<SynConstant>(syntax))
	{
		VisitParseTreeNodes(node->value, context, accept);
	}
	else if(SynConstantSet *node = getType<SynConstantSet>(syntax))
	{
		VisitParseTreeNodes(node->type, context, accept);

		for(SynBase *arg = node->constants.head; arg; arg = arg->next)
			VisitParseTreeNodes(arg, context, accept);
	}
	else if(SynClassStaticIf *node = getType<SynClassStaticIf>(syntax))
	{
		VisitParseTreeNodes(node->condition, context, accept);
		VisitParseTreeNodes(node->trueBlock, context, accept);
		VisitParseTreeNodes(node->falseBlock, context, accept);
	}
	else if(SynClassElements *node = getType<SynClassElements>(syntax))
	{
		for(SynBase *arg = node->typedefs.head; arg; arg = arg->next)
			VisitParseTreeNodes(arg, context, accept);

		for(SynBase *arg = node->functions.head; arg; arg = arg->next)
			VisitParseTreeNodes(arg, context, accept);

		for(SynBase *arg = node->accessors.head; arg; arg = arg->next)
			VisitParseTreeNodes(arg, context, accept);

		for(SynBase *arg = node->members.head; arg; arg = arg->next)
			VisitParseTreeNodes(arg, context, accept);

		for(SynBase *arg = node->constantSets.head; arg; arg = arg->next)
			VisitParseTreeNodes(arg, context, accept);

		for(SynBase *arg = node->staticIfs.head; arg; arg = arg->next)
			VisitParseTreeNodes(arg, context, accept);
	}
	else if(SynClassDefinition *node = getType<SynClassDefinition>(syntax))
	{
		VisitParseTreeNodes(node->align, context, accept);

		for(SynBase *arg = node->aliases.head; arg; arg = arg->next)
			VisitParseTreeNodes(arg, context, accept);

		VisitParseTreeNodes(node->baseClass, context, accept);
		VisitParseTreeNodes(node->elements, context, accept);
	}
	else if(SynEnumDefinition *node = getType<SynEnumDefinition>(syntax))
	{
		for(SynBase *arg = node->values.head; arg; arg = arg->next)
			VisitParseTreeNodes(arg, context, accept);
	}
	else if(SynNamespaceDefinition *node = getType<SynNamespaceDefinition>(syntax))
	{
		for(SynIdentifier *part = node->path.head; part; part = getType<SynIdentifier>(part->next))
			VisitParseTreeNodes(part, context, accept);

		for(SynBase *arg = node->expressions.head; arg; arg = arg->next)
			VisitParseTreeNodes(arg, context, accept);
	}
	else if(SynModuleImport *node = getType<SynModuleImport>(syntax))
	{
		for(SynIdentifier *part = node->path.head; part; part = getType<SynIdentifier>(part->next))
			VisitParseTreeNodes(part, context, accept);
	}
	else if(SynModule *node = getType<SynModule>(syntax))
	{
		for(SynModuleImport *import = node->imports.head; import; import = getType<SynModuleImport>(import->next))
			VisitParseTreeNodes(import, context, accept);

		for(SynBase *expr = node->expressions.head; expr; expr = expr->next)
			VisitParseTreeNodes(expr, context, accept);
	}
}